

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O3

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *buf,size_t size)

{
  long lVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  
  puVar3 = (uint *)(buf + size);
  uVar5 = ~crc;
  puVar2 = (uint *)((ulong)(buf + 3) & 0xfffffffffffffffc);
  puVar4 = (uint *)buf;
  if ((long)puVar2 - (long)buf != 0 && puVar2 <= puVar3) {
    do {
      puVar6 = (uint *)((long)puVar4 + 1);
      uVar5 = uVar5 >> 8 ^ *(uint *)(table0_ + (ulong)((uint)(byte)*puVar4 ^ uVar5 & 0xff) * 4);
      puVar4 = puVar6;
    } while (puVar6 != puVar2);
    puVar4 = (uint *)(buf + ((long)puVar2 - (long)buf));
    buf = (char *)puVar2;
  }
  lVar1 = (long)puVar3 - (long)buf;
  if (0xf < lVar1) {
    lVar1 = (long)puVar3 - (long)puVar4;
    do {
      uVar5 = uVar5 ^ *puVar4;
      uVar5 = *(uint *)(table2_ + (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(table3_ + (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)(table1_ + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(table0_ + (ulong)(uVar5 >> 0x18) * 4) ^ puVar4[1];
      uVar5 = *(uint *)(table2_ + (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(table3_ + (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)(table1_ + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(table0_ + (ulong)(uVar5 >> 0x18) * 4) ^ puVar4[2];
      uVar5 = *(uint *)(table2_ + (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(table3_ + (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)(table1_ + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(table0_ + (ulong)(uVar5 >> 0x18) * 4) ^ puVar4[3];
      puVar4 = puVar4 + 4;
      uVar5 = *(uint *)(table2_ + (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(table3_ + (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)(table1_ + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(table0_ + (ulong)(uVar5 >> 0x18) * 4);
      lVar1 = lVar1 + -0x10;
    } while (0xf < lVar1);
  }
  if (3 < lVar1) {
    lVar1 = (long)puVar3 - (long)puVar4;
    do {
      uVar5 = uVar5 ^ *puVar4;
      uVar5 = *(uint *)(table2_ + (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(table3_ + (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)(table1_ + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(table0_ + (ulong)(uVar5 >> 0x18) * 4);
      puVar4 = puVar4 + 1;
      lVar1 = lVar1 + -4;
    } while (3 < lVar1);
  }
  for (; puVar4 != puVar3; puVar4 = (uint *)((long)puVar4 + 1)) {
    uVar5 = uVar5 >> 8 ^ *(uint *)(table0_ + (ulong)((uint)(byte)*puVar4 ^ uVar5 & 0xff) * 4);
  }
  return ~uVar5;
}

Assistant:

uint32_t Extend(uint32_t crc, const char *buf, size_t size) {
            const uint8_t *p = reinterpret_cast<const uint8_t *>(buf);
            const uint8_t *e = p + size;
            uint32_t l = crc ^0xffffffffu;

#define STEP1 do {                              \
    int c = (l & 0xff) ^ *p++;                  \
    l = table0_[c] ^ (l >> 8);                  \
} while (0)
#define STEP4 do {                              \
    uint32_t c = l ^ LE_LOAD32(p);              \
    p += 4;                                     \
    l = table3_[c & 0xff] ^                     \
        table2_[(c >> 8) & 0xff] ^              \
        table1_[(c >> 16) & 0xff] ^             \
        table0_[c >> 24];                       \
} while (0)

            // Point x at first 4-byte aligned byte in string.  This might be
            // just past the end of the string.
            const uintptr_t pval = reinterpret_cast<uintptr_t>(p);
            const uint8_t *x = reinterpret_cast<const uint8_t *>(((pval + 3) >> 2) << 2);
            if (x <= e) {
                // Process bytes until finished or p is 4-byte aligned
                while (p != x) {
                    STEP1;
                }
            }
            // Process bytes 16 at a time
            while ((e - p) >= 16) {
                STEP4;
                STEP4;
                STEP4;
                STEP4;
            }
            // Process bytes 4 at a time
            while ((e - p) >= 4) {
                STEP4;
            }
            // Process the last few bytes
            while (p != e) {
                STEP1;
            }
#undef STEP4
#undef STEP1
            return l ^ 0xffffffffu;
        }